

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chess.cpp
# Opt level: O1

bool __thiscall banksia::ChessBoard::fromSanMoveList(ChessBoard *this,string *str)

{
  pointer pcVar1;
  bool bVar2;
  char cVar3;
  size_type sVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  pointer str_00;
  Move MVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vec;
  string ss;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  string local_48;
  
  pcVar1 = (str->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + str->_M_string_length);
  if (local_48._M_string_length != 0) {
    sVar4 = 0;
    do {
      if (local_48._M_dataplus._M_p[sVar4] == '.') {
        local_48._M_dataplus._M_p[sVar4] = ' ';
      }
      sVar4 = sVar4 + 1;
    } while (local_48._M_string_length != sVar4);
  }
  splitString(&local_60,&local_48,' ');
  for (str_00 = local_60.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      str_00 != local_60.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; str_00 = str_00 + 1) {
    cVar3 = '\x03';
    if ((1 < str_00->_M_string_length) && (9 < (int)*(str_00->_M_dataplus)._M_p - 0x30U)) {
      MVar5 = fromSanString(this,str_00);
      bVar2 = checkMake(this,MVar5.from,MVar5.dest,MVar5.promotion);
      cVar3 = !bVar2;
    }
    if ((cVar3 != '\x03') && (cVar3 != '\0')) break;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return str_00 == local_60.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
}

Assistant:

bool ChessBoard::fromSanMoveList(const std::string& str)
{
    // Some opening such as Gaviota one has no space between counter and move, e.g.
    // 1.d4 d5 2.c4 dxc4 3.Nf3 a6 4.e3 Nf6 5.Bxc4 b5 6.Bd3 Bb7 7.O-O Nbd7 8.b4 *
    auto ss = str;
    std::replace(ss.begin(), ss.end(), '.', ' ');
    auto vec = splitString(ss, ' ');
    
    for(auto && s : vec) {
        if (s.length() < 2 || isdigit(s.at(0))) {
            continue;
        }
        
        auto move = fromSanString(s);
        if (!checkMake(move.from, move.dest, move.promotion)) {
            return false;
        }
    }
    return true;
}